

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeGeneric::Build_CqT
          (ChConstraintThreeGeneric *this,ChSparseMatrix *storage,int inscol)

{
  ChRowVectorDynamic<double> *local_68;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_60;
  
  if (((this->super_ChConstraintThree).variables_a)->disabled == false) {
    local_68 = &this->Cq_a;
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_60,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_68,
               (type *)0x0);
    PasteMatrix(storage,&local_60,((this->super_ChConstraintThree).variables_a)->offset,inscol,true)
    ;
    Eigen::internal::handmade_aligned_free
              (local_60.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
  }
  if (((this->super_ChConstraintThree).variables_b)->disabled == false) {
    local_68 = &this->Cq_b;
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_60,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_68,
               (type *)0x0);
    PasteMatrix(storage,&local_60,((this->super_ChConstraintThree).variables_b)->offset,inscol,true)
    ;
    Eigen::internal::handmade_aligned_free
              (local_60.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
  }
  if (((this->super_ChConstraintThree).variables_c)->disabled == false) {
    local_68 = &this->Cq_c;
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_60,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_68,
               (type *)0x0);
    PasteMatrix(storage,&local_60,((this->super_ChConstraintThree).variables_c)->offset,inscol,true)
    ;
    Eigen::internal::handmade_aligned_free
              (local_60.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::Build_CqT(ChSparseMatrix& storage, int inscol) {
    if (variables_a->IsActive())
        PasteMatrix(storage, Cq_a.transpose(), variables_a->GetOffset(), inscol);
    if (variables_b->IsActive())
        PasteMatrix(storage, Cq_b.transpose(), variables_b->GetOffset(), inscol);
    if (variables_c->IsActive())
        PasteMatrix(storage, Cq_c.transpose(), variables_c->GetOffset(), inscol);
}